

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

void N_VDestroyVectorArray(N_Vector *vs,int count)

{
  ulong uVar1;
  
  if (vs != (N_Vector *)0x0) {
    if (0 < count) {
      uVar1 = 0;
      do {
        N_VDestroy(vs[uVar1]);
        vs[uVar1] = (N_Vector)0x0;
        uVar1 = uVar1 + 1;
      } while ((uint)count != uVar1);
    }
    free(vs);
    return;
  }
  return;
}

Assistant:

void N_VDestroyVectorArray(N_Vector* vs, int count)
{
  int j;

  if (vs == NULL) { return; }

  for (j = 0; j < count; j++)
  {
    N_VDestroy(vs[j]);
    vs[j] = NULL;
  }

  free(vs);
  vs = NULL;

  return;
}